

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_follow(Curl_easy *data,char *newurl,followtype type)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  uchar *ptr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t __n;
  bool bVar8;
  char cVar9;
  long lVar10;
  long lVar11;
  undefined8 unaff_R12;
  ulong uVar12;
  char cVar13;
  char prot [16];
  undefined1 local_61;
  char *local_60;
  int local_58;
  uint local_54;
  char *local_50;
  undefined1 local_48 [24];
  
  if (type == FOLLOW_REDIR) {
    lVar10 = (data->set).followlocation;
    lVar11 = (data->set).maxredirs;
    if (lVar11 <= lVar10 && lVar11 != -1) {
      type = FOLLOW_FAKE;
      uVar12 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
      goto LAB_0051dbd1;
    }
    (data->state).this_is_a_follow = true;
    (data->set).followlocation = lVar10 + 1;
    type = FOLLOW_REDIR;
    if ((data->set).http_auto_referer == true) {
      if ((data->change).referer_alloc == true) {
        (*Curl_cfree)((data->change).referer);
        (data->change).referer = (char *)0x0;
        (data->change).referer_alloc = false;
      }
      pcVar4 = (*Curl_cstrdup)((data->change).url);
      (data->change).referer = pcVar4;
      if (pcVar4 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (data->change).referer_alloc = true;
    }
  }
  uVar12 = 0;
LAB_0051dbd1:
  iVar3 = __isoc99_sscanf(newurl,"%15[^?&/:]://%c",local_48,&local_61);
  if (iVar3 == 2) {
    bVar8 = true;
    lVar10 = 0;
    pcVar4 = newurl;
    do {
      cVar9 = *pcVar4;
      if (cVar9 == ' ') {
        if (bVar8) {
          lVar10 = lVar10 + 3;
          bVar8 = true;
        }
        else {
          lVar10 = lVar10 + 1;
          bVar8 = false;
        }
      }
      else {
        if (cVar9 == '?') {
          bVar8 = false;
        }
        else if (cVar9 == '\0') goto LAB_0051dcab;
        lVar11 = lVar10 + 2;
        if (-1 < cVar9) {
          lVar11 = lVar10;
        }
        lVar10 = lVar11 + 1;
      }
      pcVar4 = pcVar4 + 1;
    } while( true );
  }
  local_58 = iVar3;
  local_50 = (*Curl_cstrdup)((data->change).url);
  if (local_50 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar5 = strstr(local_50,"//");
  pcVar4 = pcVar5 + 2;
  if (pcVar5 == (char *)0x0) {
    pcVar4 = local_50;
  }
  cVar9 = *newurl;
  local_54 = (uint)uVar12;
  if (cVar9 == '/') {
    if (newurl[1] == '/') {
      *pcVar4 = '\0';
      newurl = newurl + 2;
    }
    else {
      pcVar5 = strchr(pcVar4,0x2f);
      pcVar7 = strchr(pcVar4,0x3f);
      if (pcVar5 == (char *)0x0) {
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '\0';
        }
      }
      else {
        pcVar6 = pcVar5;
        if (pcVar7 < pcVar5) {
          pcVar6 = pcVar7;
        }
        if (pcVar7 == (char *)0x0) {
          pcVar6 = pcVar5;
        }
        *pcVar6 = '\0';
      }
    }
  }
  else {
    local_60 = (char *)CONCAT44(local_60._4_4_,type);
    pcVar5 = strchr(pcVar4,0x3f);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      cVar9 = *newurl;
    }
    cVar13 = '?';
    if ((cVar9 != '?') && (pcVar5 = strrchr(pcVar4,0x2f), cVar13 = cVar9, pcVar5 != (char *)0x0)) {
      *pcVar5 = '\0';
      cVar13 = *newurl;
    }
    pcVar6 = strchr(pcVar4,0x2f);
    pcVar5 = pcVar6 + 1;
    pcVar7 = pcVar5;
    if (pcVar6 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    type = (followtype)local_60;
    iVar3 = 0;
    if ((cVar13 == '.') &&
       (newurl = newurl + (ulong)(newurl[1] == '/') * 2, iVar3 = 0, *newurl == '.')) {
      iVar3 = 0;
      pcVar4 = newurl;
      do {
        newurl = pcVar4;
        if ((pcVar4[1] != '.') || (pcVar4[2] != '/')) break;
        iVar3 = iVar3 + 1;
        newurl = pcVar4 + 3;
        pcVar1 = pcVar4 + 3;
        pcVar4 = newurl;
      } while (*pcVar1 == '.');
    }
    pcVar4 = pcVar5;
    if (pcVar6 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      for (; iVar3 != 0; iVar3 = iVar3 + -1) {
        pcVar4 = strrchr(pcVar7,0x2f);
        if (pcVar4 == (char *)0x0) {
          *pcVar7 = '\0';
          pcVar4 = pcVar5;
          break;
        }
        *pcVar4 = '\0';
        pcVar4 = pcVar7;
      }
    }
  }
  pcVar5 = local_50;
  bVar8 = true;
  lVar10 = 0;
  pcVar7 = newurl;
  do {
    cVar9 = *pcVar7;
    if (cVar9 == ' ') {
      if (bVar8) {
        lVar10 = lVar10 + 3;
        bVar8 = true;
      }
      else {
        lVar10 = lVar10 + 1;
        bVar8 = false;
      }
    }
    else {
      if (cVar9 == '?') {
        bVar8 = false;
      }
      else if (cVar9 == '\0') goto LAB_0051de34;
      lVar11 = lVar10 + 2;
      if (-1 < cVar9) {
        lVar11 = lVar10;
      }
      lVar10 = lVar11 + 1;
    }
    pcVar7 = pcVar7 + 1;
  } while( true );
LAB_0051dcab:
  pcVar4 = (char *)(*Curl_cmalloc)(lVar10 + 1);
  if (pcVar4 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  strcpy_url(pcVar4,newurl);
  goto LAB_0051dedd;
LAB_0051de34:
  local_60 = pcVar4;
  __n = strlen(local_50);
  pcVar4 = (char *)(*Curl_cmalloc)(__n + lVar10 + 2);
  if (pcVar4 == (char *)0x0) {
    (*Curl_cfree)(pcVar5);
    return CURLE_OUT_OF_MEMORY;
  }
  memcpy(pcVar4,pcVar5,__n);
  iVar3 = local_58;
  cVar9 = *newurl;
  if (cVar9 != '/') {
    if (local_60 == (char *)0x0) {
      if (cVar9 != '?') goto LAB_0051deb3;
    }
    else if ((cVar9 != '?') && (*local_60 != '\0')) {
LAB_0051deb3:
      pcVar4[__n] = '/';
      __n = __n + 1;
    }
  }
  strcpy_url(pcVar4 + __n,newurl);
  (*Curl_cfree)(local_50);
  uVar12 = (ulong)local_54;
LAB_0051dedd:
  if (type == FOLLOW_FAKE) {
    (data->info).wouldredirect = pcVar4;
    if ((char)uVar12 != '\0') {
      Curl_failf(data,"Maximum (%ld) redirects followed",(data->set).maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }
    return CURLE_OK;
  }
  if (iVar3 == 2) {
    (data->state).allow_port = false;
  }
  if ((data->change).url_alloc == true) {
    (*Curl_cfree)((data->change).url);
  }
  (data->change).url = pcVar4;
  (data->change).url_alloc = true;
  Curl_infof(data,"Issue another request to this URL: \'%s\'\n",pcVar4);
  iVar3 = (data->info).httpcode;
  if (iVar3 == 0x12f) {
    if (((data->set).httpreq != HTTPREQ_GET) && (((data->set).keep_post & 4) == 0)) {
      (data->set).httpreq = HTTPREQ_GET;
      pcVar4 = "GET";
      if ((data->set).opt_no_body != false) {
        pcVar4 = "HEAD";
      }
      Curl_infof(data,"Disables POST, goes with %s\n",pcVar4);
    }
  }
  else {
    if (iVar3 == 0x12e) {
      if (((data->set).httpreq & ~HTTPREQ_GET) != HTTPREQ_POST) goto LAB_0051e015;
      bVar2 = (byte)(data->set).keep_post & 2;
    }
    else {
      if ((iVar3 != 0x12d) || (((data->set).httpreq & ~HTTPREQ_GET) != HTTPREQ_POST))
      goto LAB_0051e015;
      bVar2 = (byte)(data->set).keep_post & 1;
    }
    if (bVar2 == 0) {
      Curl_infof(data,"Switch from POST to GET\n");
      (data->set).httpreq = HTTPREQ_GET;
    }
  }
LAB_0051e015:
  Curl_pgrsTime(data,TIMER_REDIRECT);
  Curl_pgrsResetTimesSizes(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_follow(struct Curl_easy *data,
                     char *newurl,    /* the Location: string */
                     followtype type) /* see transfer.h */
{
#ifdef CURL_DISABLE_HTTP
  (void)data;
  (void)newurl;
  (void)type;
  /* Location: following will not happen when HTTP is disabled */
  return CURLE_TOO_MANY_REDIRECTS;
#else

  /* Location: redirect */
  bool disallowport = FALSE;
  bool reachedmax = FALSE;

  if(type == FOLLOW_REDIR) {
    if((data->set.maxredirs != -1) &&
       (data->set.followlocation >= data->set.maxredirs)) {
      reachedmax = TRUE;
      type = FOLLOW_FAKE; /* switch to fake to store the would-be-redirected
                             to URL */
    }
    else {
      /* mark the next request as a followed location: */
      data->state.this_is_a_follow = TRUE;

      data->set.followlocation++; /* count location-followers */

      if(data->set.http_auto_referer) {
        /* We are asked to automatically set the previous URL as the referer
           when we get the next URL. We pick the ->url field, which may or may
           not be 100% correct */

        if(data->change.referer_alloc) {
          Curl_safefree(data->change.referer);
          data->change.referer_alloc = FALSE;
        }

        data->change.referer = strdup(data->change.url);
        if(!data->change.referer)
          return CURLE_OUT_OF_MEMORY;
        data->change.referer_alloc = TRUE; /* yes, free this later */
      }
    }
  }

  if(!is_absolute_url(newurl))  {
    /***
     *DANG* this is an RFC 2068 violation. The URL is supposed
     to be absolute and this doesn't seem to be that!
     */
    char *absolute = concat_url(data->change.url, newurl);
    if(!absolute)
      return CURLE_OUT_OF_MEMORY;
    newurl = absolute;
  }
  else {
    /* The new URL MAY contain space or high byte values, that means a mighty
       stupid redirect URL but we still make an effort to do "right". */
    char *newest;
    size_t newlen = strlen_url(newurl);

    /* This is an absolute URL, don't allow the custom port number */
    disallowport = TRUE;

    newest = malloc(newlen+1); /* get memory for this */
    if(!newest)
      return CURLE_OUT_OF_MEMORY;
    strcpy_url(newest, newurl); /* create a space-free URL */
    newurl = newest; /* use this instead now */

  }

  if(type == FOLLOW_FAKE) {
    /* we're only figuring out the new url if we would've followed locations
       but now we're done so we can get out! */
    data->info.wouldredirect = newurl;

    if(reachedmax) {
      failf(data, "Maximum (%ld) redirects followed", data->set.maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }
    return CURLE_OK;
  }

  if(disallowport)
    data->state.allow_port = FALSE;

  if(data->change.url_alloc) {
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }

  data->change.url = newurl;
  data->change.url_alloc = TRUE;

  infof(data, "Issue another request to this URL: '%s'\n", data->change.url);

  /*
   * We get here when the HTTP code is 300-399 (and 401). We need to perform
   * differently based on exactly what return code there was.
   *
   * News from 7.10.6: we can also get here on a 401 or 407, in case we act on
   * a HTTP (proxy-) authentication scheme other than Basic.
   */
  switch(data->info.httpcode) {
    /* 401 - Act on a WWW-Authenticate, we keep on moving and do the
       Authorization: XXXX header in the HTTP request code snippet */
    /* 407 - Act on a Proxy-Authenticate, we keep on moving and do the
       Proxy-Authorization: XXXX header in the HTTP request code snippet */
    /* 300 - Multiple Choices */
    /* 306 - Not used */
    /* 307 - Temporary Redirect */
  default:  /* for all above (and the unknown ones) */
    /* Some codes are explicitly mentioned since I've checked RFC2616 and they
     * seem to be OK to POST to.
     */
    break;
  case 301: /* Moved Permanently */
    /* (quote from RFC7231, section 6.4.2)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM)
       && !(data->set.keep_post & CURL_REDIR_POST_301)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;
  case 302: /* Found */
    /* (quote from RFC7231, section 6.4.3)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM)
       && !(data->set.keep_post & CURL_REDIR_POST_302)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;

  case 303: /* See Other */
    /* Disable both types of POSTs, unless the user explicitly
       asks for POST after POST */
    if(data->set.httpreq != HTTPREQ_GET
      && !(data->set.keep_post & CURL_REDIR_POST_303)) {
      data->set.httpreq = HTTPREQ_GET; /* enforce GET request */
      infof(data, "Disables POST, goes with %s\n",
            data->set.opt_no_body?"HEAD":"GET");
    }
    break;
  case 304: /* Not Modified */
    /* 304 means we did a conditional request and it was "Not modified".
     * We shouldn't get any Location: header in this response!
     */
    break;
  case 305: /* Use Proxy */
    /* (quote from RFC2616, section 10.3.6):
     * "The requested resource MUST be accessed through the proxy given
     * by the Location field. The Location field gives the URI of the
     * proxy.  The recipient is expected to repeat this single request
     * via the proxy. 305 responses MUST only be generated by origin
     * servers."
     */
    break;
  }
  Curl_pgrsTime(data, TIMER_REDIRECT);
  Curl_pgrsResetTimesSizes(data);

  return CURLE_OK;
#endif /* CURL_DISABLE_HTTP */
}